

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O3

void __thiscall
dlib::
array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
::resize(array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
         *this,size_t new_size)

{
  bool bVar1;
  task_state_type *item;
  task_state_type *ptVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined4 extraout_var;
  size_t i;
  ulong uVar10;
  long lVar11;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  task_state_type *ptStack_40;
  task_state_type *local_38;
  bool local_30;
  
  if (this->max_array_size < new_size) {
    local_68._0_8_ = &PTR__array_001faae0;
    local_68._8_8_ = &PTR__memory_manager_stateless_kernel_1_001fab60;
    _local_58 = ZEXT1632(ZEXT816(0) << 0x40);
    local_38 = (task_state_type *)0x0;
    local_30 = true;
    set_max_size((array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
                  *)local_68,new_size);
    set_size((array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
              *)local_68,new_size);
    lVar11 = 0;
    uVar10 = 0;
    while( true ) {
      iVar9 = (*(this->super_enumerable<dlib::thread_pool_implementation::task_state_type>).
                _vptr_enumerable[8])(this);
      auVar6 = _local_58;
      uVar8 = local_58._16_8_;
      if (CONCAT44(extraout_var,iVar9) <= uVar10) break;
      std::swap<dlib::thread_pool_implementation::task_state_type>
                ((task_state_type *)(&this->array_elements->is_being_processed + lVar11),
                 (task_state_type *)((bool *)local_58._16_8_ + lVar11));
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x1a0;
    }
    uVar5 = local_58._0_8_;
    uVar7 = local_58._8_8_;
    uVar3 = this->array_size;
    uVar4 = this->max_array_size;
    local_58._8_8_ = uVar4;
    local_58._0_8_ = uVar3;
    this->array_size = uVar5;
    this->max_array_size = uVar7;
    bVar1 = this->_at_start;
    this->_at_start = local_30;
    ptStack_40 = auVar6._24_8_;
    ptVar2 = ptStack_40;
    item = this->array_elements;
    local_58._16_8_ = this->array_elements;
    ptStack_40 = this->pos;
    this->array_elements = (task_state_type *)uVar8;
    this->pos = ptVar2;
    ptVar2 = this->last_pos;
    this->last_pos = local_38;
    local_68._0_8_ = &PTR__array_001faae0;
    if (item != (task_state_type *)0x0) {
      local_38 = ptVar2;
      local_30 = bVar1;
      memory_manager_stateless_kernel_1<dlib::thread_pool_implementation::task_state_type>::
      deallocate_array((memory_manager_stateless_kernel_1<dlib::thread_pool_implementation::task_state_type>
                        *)(local_68 + 8),item);
    }
    return;
  }
  set_size(this,new_size);
  return;
}

Assistant:

void array<T,mem_manager>::
    resize (
        size_t new_size
    )
    {
        if (this->max_size() < new_size)
        {
            array temp;
            temp.set_max_size(new_size);
            temp.set_size(new_size);
            for (size_t i = 0; i < this->size(); ++i)
            {
                exchange((*this)[i],temp[i]);
            }
            temp.swap(*this);
        }
        else
        {
            this->set_size(new_size);
        }
    }